

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_drawGrid(int color)

{
  double *y;
  double *y_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  mline_t ml;
  mline_t local_68;
  double local_48;
  double local_40;
  double local_38;
  
  dVar5 = bmaporgx;
  dVar6 = m_y;
  dVar3 = m_x;
  dVar4 = SQRT(m_h * m_h + m_w * m_w);
  dVar7 = (dVar4 - m_w) * 0.5;
  local_48 = (dVar4 - m_h) * 0.5;
  local_40 = m_x - dVar7;
  dVar1 = ceil((local_40 - bmaporgx) * 0.0078125);
  dVar2 = dVar6 - local_48;
  y = &local_68.a.y;
  local_38 = dVar4 + dVar2;
  y_00 = &local_68.b.y;
  for (dVar5 = dVar1 * 128.0 + dVar5; dVar1 = bmaporgy, dVar5 < (dVar3 + dVar4) - dVar7;
      dVar5 = dVar5 + 128.0) {
    local_68.b.y = local_38;
    local_68.a.x = dVar5;
    local_68.a.y = dVar2;
    local_68.b.x = dVar5;
    if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
      AM_rotatePoint((double *)&local_68,y);
      AM_rotatePoint(&local_68.b.x,y_00);
    }
    AM_drawMline(&local_68,color);
  }
  dVar3 = ceil((dVar2 - bmaporgy) * 0.0078125);
  dVar6 = (dVar6 + dVar4) - local_48;
  dVar4 = dVar4 + local_40;
  for (dVar1 = dVar3 * 128.0 + dVar1; dVar1 < dVar6; dVar1 = dVar1 + 128.0) {
    local_68.a.x = local_40;
    local_68.a.y = dVar1;
    local_68.b.x = dVar4;
    local_68.b.y = dVar1;
    if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
      AM_rotatePoint((double *)&local_68,y);
      AM_rotatePoint(&local_68.b.x,y_00);
    }
    AM_drawMline(&local_68,color);
  }
  return;
}

Assistant:

void AM_drawGrid (int color)
{
	double x, y;
	double start, end;
	mline_t ml;
	double minlen, extx, exty;
	double minx, miny;

	// [RH] Calculate a minimum for how long the grid lines should be so that
	// they cover the screen at any rotation.
	minlen = sqrt (m_w*m_w + m_h*m_h);
	extx = (minlen - m_w) / 2;
	exty = (minlen - m_h) / 2;

	minx = m_x;
	miny = m_y;

	// Figure out start of vertical gridlines
	start = minx - extx;
	start = ceil((start - bmaporgx) / MAPBLOCKUNITS) * MAPBLOCKUNITS + bmaporgx;

	end = minx + minlen - extx;

	// draw vertical gridlines
	for (x = start; x < end; x += MAPBLOCKUNITS)
	{
		ml.a.x = x;
		ml.b.x = x;
		ml.a.y = miny - exty;
		ml.b.y = ml.a.y + minlen;
		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			AM_rotatePoint (&ml.a.x, &ml.a.y);
			AM_rotatePoint (&ml.b.x, &ml.b.y);
		}
		AM_drawMline(&ml, color);
	}

	// Figure out start of horizontal gridlines
	start = miny - exty;
	start = ceil((start - bmaporgy) / MAPBLOCKUNITS) * MAPBLOCKUNITS + bmaporgy;
	end = miny + minlen - exty;

	// draw horizontal gridlines
	for (y=start; y<end; y+=MAPBLOCKUNITS)
	{
		ml.a.x = minx - extx;
		ml.b.x = ml.a.x + minlen;
		ml.a.y = y;
		ml.b.y = y;
		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			AM_rotatePoint (&ml.a.x, &ml.a.y);
			AM_rotatePoint (&ml.b.x, &ml.b.y);
		}
		AM_drawMline (&ml, color);
	}
}